

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matcher.hpp
# Opt level: O3

bool Kernel::MatchingUtils::
     matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
               (Term *base,Term *instance,Binder *binder)

{
  uint uVar1;
  ulong uVar2;
  anon_union_8_2_f154dc0f_for_Term_10 this;
  sockaddr *psVar3;
  sockaddr *__addr;
  bool bVar4;
  int iVar5;
  TermList base_00;
  TermList **ppTVar6;
  TermList **ppTVar7;
  uint uVar8;
  Binder *in_RCX;
  int iVar9;
  sockaddr *psVar10;
  TermList *pTVar11;
  TermList *pTVar12;
  Literal *l2;
  Literal *l1;
  
  uVar2 = base->_args[0]._content;
  if ((((uVar2 & 8) != 0) && ((instance->_args[0]._content & 8) != 0)) &&
     (in_RCX = (Binder *)(ulong)base->_weight, instance->_weight < base->_weight)) {
    return false;
  }
  if (((uVar2 & 0x10) != 0) && (*(int *)&base->field_0xc < 0)) {
    this = base->field_9;
    base_00 = SortHelper::getEqualityArgumentSort((Literal *)instance);
    bVar4 = matchTerms<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
                      ((MatchingUtils *)this,base_00,(TermList)binder,in_RCX);
    if (!bVar4) {
      return false;
    }
  }
  uVar8 = *(uint *)&base->field_0xc;
  uVar1 = *(uint *)&instance->field_0xc;
  if ((matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>(Kernel::Term*,Kernel::Term*,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder&)
       ::subterms == '\0') &&
     (iVar5 = __cxa_guard_acquire(&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>(Kernel::Term*,Kernel::Term*,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder&)
                                   ::subterms), iVar5 != 0)) {
    matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
    ::subterms._capacity = 0x20;
    matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
    ::subterms._stack = (TermList **)::operator_new(0x100,0x10);
    matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
    ::subterms._end =
         matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
         ::subterms._stack +
         matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
         ::subterms._capacity;
    matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
    ::subterms._cursor =
         matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
         ::subterms._stack;
    __cxa_atexit(Lib::Stack<Kernel::TermList_*>::~Stack,
                 &matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
                  ::subterms,&__dso_handle);
    __cxa_guard_release(&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>(Kernel::Term*,Kernel::Term*,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder&)
                         ::subterms);
  }
  pTVar12 = base->_args + (uVar8 & 0xfffffff);
  pTVar11 = instance->_args + (uVar1 & 0xfffffff);
  matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>::
  subterms._cursor =
       matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
       ::subterms._stack;
  ppTVar6 = matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
            ::subterms._stack;
  do {
    while( true ) {
      if (((undefined1  [16])*(sockaddr *)(pTVar12 + -1) & (undefined1  [16])0x3) !=
          (undefined1  [16])0x2) {
        if (ppTVar6 ==
            matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
            ::subterms._end) {
          Lib::Stack<Kernel::TermList_*>::expand
                    (&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
                      ::subterms);
          ppTVar6 = matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
                    ::subterms._cursor;
        }
        *ppTVar6 = (TermList *)(pTVar11 + -1);
        matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
        ::subterms._cursor =
             matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
             ::subterms._cursor + 1;
        if (matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
            ::subterms._cursor ==
            matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
            ::subterms._end) {
          Lib::Stack<Kernel::TermList_*>::expand
                    (&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
                      ::subterms);
        }
        *matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
         ::subterms._cursor = (TermList *)(pTVar12 + -1);
        ppTVar6 = matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
                  ::subterms._cursor + 1;
        matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
        ::subterms._cursor = ppTVar6;
      }
      psVar3 = (sockaddr *)pTVar12->_content;
      uVar8 = (uint)psVar3 & 3;
      ppTVar7 = ppTVar6;
      if (uVar8 != 3) break;
      *(uint64_t *)
       ((long)&((binder->_parent->_specVars)._array)->_content + ((ulong)psVar3 & 0x3fffffffc) * 2)
           = pTVar11->_content;
LAB_00311823:
      if (ppTVar7 ==
          matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
          ::subterms._stack) {
        return true;
      }
      pTVar12 = ppTVar7[-1];
      ppTVar6 = ppTVar7 + -2;
      pTVar11 = ppTVar7[-2];
      matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
      ::subterms._cursor = ppTVar6;
    }
    __addr = (sockaddr *)pTVar11->_content;
    if (((uint)__addr & 3) == 3) {
      *(sockaddr **)
       ((long)&((binder->_parent->_specVars)._array)->_content + ((ulong)__addr & 0x3fffffffc) * 2)
           = psVar3;
      goto LAB_00311823;
    }
    if (((ulong)psVar3 & 3) != 0) {
      iVar5 = Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder
              ::bind(binder,(int)((ulong)psVar3 >> 2),__addr,uVar8);
      ppTVar7 = matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
                ::subterms._cursor;
      if ((char)iVar5 == '\0') {
        return false;
      }
      goto LAB_00311823;
    }
    if (((ulong)__addr & 3) != 0) {
      return false;
    }
    if (*(int *)(psVar3->sa_data + 6) != *(int *)(__addr->sa_data + 6)) {
      return false;
    }
    if (((psVar3[2].sa_data[6] & 8U) != 0) && ((__addr[2].sa_data[6] & 8U) != 0)) {
      psVar10 = psVar3;
      if (*(int *)(psVar3->sa_data + 10) < 0) {
        iVar5 = 0;
        do {
          psVar10 = *(sockaddr **)(psVar10 + 2);
          if (((ulong)psVar10 & 1) != 0) {
            iVar9 = 3;
            goto LAB_0031189b;
          }
          iVar5 = iVar5 + 2;
        } while (*(int *)(psVar10->sa_data + 10) < 0);
      }
      else {
        iVar5 = 0;
      }
      iVar9._0_2_ = psVar10[2].sa_family;
      iVar9._2_1_ = psVar10[2].sa_data[0];
      iVar9._3_1_ = psVar10[2].sa_data[1];
LAB_0031189b:
      if ((psVar3 != __addr) && (iVar9 == -iVar5)) {
        return false;
      }
      uVar1._0_2_ = psVar3[1].sa_family;
      uVar1._2_1_ = psVar3[1].sa_data[0];
      uVar1._3_1_ = psVar3[1].sa_data[1];
      uVar8._0_2_ = __addr[1].sa_family;
      uVar8._2_1_ = __addr[1].sa_data[0];
      uVar8._3_1_ = __addr[1].sa_data[1];
      if (uVar8 < uVar1) {
        return false;
      }
    }
    if ((*(uint *)(psVar3->sa_data + 10) & 0xfffffff) == 0) goto LAB_00311823;
    pTVar12 = (TermList *)
              (psVar3[2].sa_data + 6 + ((ulong)*(uint *)(psVar3->sa_data + 10) & 0xfffffff) * 8);
    pTVar11 = (TermList *)
              (__addr[2].sa_data + (ulong)(*(uint *)(__addr->sa_data + 10) & 0xfffffff) * 8 + 6);
  } while( true );
}

Assistant:

bool MatchingUtils::matchArgs(Term* base, Term* instance, Binder& binder)
{
  ASS_EQ(base->functor(),instance->functor());
  if(base->shared() && instance->shared()) {
    if(base->weight() > instance->weight()) {
      return false;
    }
  }
  // Note: while this function only cares about the term structure,
  // for two-variable equalities we need to get the sort of the arguments from the Literal object.
  if(base->isLiteral() && static_cast<Literal*>(base)->isTwoVarEquality()){
    Literal* l1 = static_cast<Literal*>(base);
    Literal* l2 = static_cast<Literal*>(instance);
    if(!matchTerms(l1->twoVarEqSort(), SortHelper::getEqualityArgumentSort(l2), binder)){
      return false;
    }
  }
  ASS_G(base->arity(),0);

  TermList* bt=base->args();
  TermList* it=instance->args();

  static Stack<TermList*> subterms(32);
  subterms.reset();

  for (;;) {
    if (!bt->next()->isEmpty()) {
      subterms.push(it->next());
      subterms.push(bt->next());
    }
    if(bt->isSpecialVar()) {
      binder.specVar(bt->var(), *it);
    } else if(it->isSpecialVar()) {
      binder.specVar(it->var(), *bt);
    } else if(bt->isTerm()) {
      if(!it->isTerm()) {
	return false;
      }
      Term* s = bt->term();
      Term* t = it->term();
      if(s->functor()!=t->functor()) {
	return false;
      }
      if(bt->term()->shared() && it->term()->shared()) {
	if(bt->term()->ground() && *bt!=*it) {
	  return false;
	}
	if(s->weight() > t->weight()) {
	  return false;
	}
      }
      if(s->arity() > 0) {
	bt = s->args();
	it = t->args();
	continue;
      }
    } else {
      ASS(bt->isOrdinaryVar());
      if(!binder.bind(bt->var(), *it)) {
	return false;
      }
    }
    if(subterms.isEmpty()) {
      return true;
    }
    bt = subterms.pop();
    it = subterms.pop();
  }
}